

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::VerifySign(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
  local_58;
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::VerifySignResponseStruct(cfd::js::api::VerifySignRequestStruct_const&)>::
  function<cfd::js::api::VerifySignResponseStruct(&)(cfd::js::api::VerifySignRequestStruct_const&),void>
            ((function<cfd::js::api::VerifySignResponseStruct(cfd::js::api::VerifySignRequestStruct_const&)>
              *)&local_38,TransactionStructApi::VerifySign);
  std::
  function<cfd::js::api::VerifySignResponseStruct(cfd::js::api::VerifySignRequestStruct_const&)>::
  function<cfd::js::api::VerifySignResponseStruct(&)(cfd::js::api::VerifySignRequestStruct_const&),void>
            ((function<cfd::js::api::VerifySignResponseStruct(cfd::js::api::VerifySignRequestStruct_const&)>
              *)&local_58,ElementsTransactionStructApi::VerifySign);
  ExecuteElementsCheckApi<cfd::js::api::json::VerifySignRequest,cfd::js::api::json::VerifySignResponse,cfd::js::api::VerifySignRequestStruct,cfd::js::api::VerifySignResponseStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>::
  ~function(&local_58);
  std::
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>::
  ~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::VerifySign(const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::VerifySignRequest, api::json::VerifySignResponse,
      api::VerifySignRequestStruct, api::VerifySignResponseStruct>(
      request_message, TransactionStructApi::VerifySign,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::VerifySign);
#else
      TransactionStructApi::VerifySign);
#endif
}